

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O2

void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *p,int fUseAssign)

{
  Vec_Int_t *p_00;
  int iVar1;
  Vec_Str_t *p_01;
  Abc_Nam_t *p_02;
  Vec_Str_t *pVVar2;
  Bac_Man_t *pBVar3;
  int iVar4;
  Bac_ObjType_t BVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int i;
  char *pcVar10;
  Mio_Library_t *pLib;
  Mio_Gate_t *pGate;
  char *pcVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  Bac_Ntk_t *p_03;
  uint uVar19;
  uint i_00;
  uint uVar20;
  uint local_7c;
  
  p_01 = p->pDesign->vOut;
  iVar15 = -1;
  iVar14 = 1;
  i_00 = 0;
LAB_00326ee3:
  if ((p->vType).nSize <= (int)i_00) {
    return;
  }
  iVar4 = Bac_ObjIsBox(p,i_00);
  if ((iVar4 != 0) && (iVar4 = Bac_ObjIsConst(p,i_00), iVar4 == 0)) {
    BVar5 = Bac_ObjType(p,i_00);
    if (BVar5 == BAC_BOX_GATE) {
      p_02 = p->pDesign->pMods;
      pVVar2 = p->pDesign->vOut;
      iVar4 = Bac_BoxNtkId(p,i_00);
      pcVar10 = Abc_NamStr(p_02,iVar4);
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      pGate = Mio_LibraryReadGateByName(pLib,pcVar10,(char *)0x0);
      Vec_StrPrintStr(pVVar2,"  ");
      Vec_StrPrintStr(pVVar2,pcVar10);
      Vec_StrPrintStr(pVVar2," ");
      iVar4 = Bac_ObjName(p,i_00);
      pcVar10 = "";
      if (iVar4 != 0) {
        pcVar10 = Bac_ObjNameStr(p,i_00);
      }
      Vec_StrPrintStr(pVVar2,pcVar10);
      Vec_StrPrintStr(pVVar2," (");
      iVar12 = 0;
      iVar4 = iVar15;
      while ((iVar18 = iVar14, iVar4 != -1 && (iVar6 = Bac_ObjIsBi(p,iVar4), iVar6 != 0))) {
        pcVar10 = ", .";
        if (iVar12 == 0) {
          pcVar10 = ".";
        }
        Vec_StrPrintStr(pVVar2,pcVar10);
        pcVar10 = Mio_GateReadPinName(pGate,iVar12);
        Vec_StrPrintStr(pVVar2,pcVar10);
        Vec_StrPrintStr(pVVar2,"(");
        Bac_ManWriteSig(p,iVar4);
        Vec_StrPrintStr(pVVar2,")");
        iVar12 = iVar12 + 1;
        iVar4 = iVar4 + -1;
      }
      while ((iVar18 < (p->vType).nSize && (iVar4 = Bac_ObjIsBo(p,iVar18), iVar4 != 0))) {
        iVar4 = Bac_BoxBiNum(p,i_00);
        pcVar10 = ", .";
        if (iVar4 == 0) {
          pcVar10 = ".";
        }
        Vec_StrPrintStr(pVVar2,pcVar10);
        pcVar10 = Mio_GateReadOutName(pGate);
        Vec_StrPrintStr(pVVar2,pcVar10);
        Vec_StrPrintStr(pVVar2,"(");
        Bac_ManWriteSig(p,iVar18);
        Vec_StrPrintStr(pVVar2,")");
        iVar18 = iVar18 + 1;
      }
      Vec_StrPrintStr(pVVar2,");\n");
      goto LAB_00327957;
    }
    iVar4 = Bac_ObjIsBoxUser(p,i_00);
    if ((fUseAssign != 0) && (iVar4 == 0)) {
      pVVar2 = p->pDesign->vOut;
      BVar5 = Bac_ObjType(p,i_00);
      iVar4 = Bac_BoxBiNum(p,i_00);
      iVar12 = Bac_BoxBoNum(p,i_00);
      if (iVar12 != 1) {
        __assert_fail("nOutputs == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                      ,0x1ad,"void Bac_ManWriteAssign(Bac_Ntk_t *, int)");
      }
      Vec_StrPrintStr(pVVar2,"  assign ");
      Bac_ManWriteSig(p,i_00 + 1);
      Vec_StrPrintStr(pVVar2," = ");
      if (iVar4 == 2) {
        if ((BVar5 < BAC_BOX_MUX) && ((0xaa000U >> (BVar5 & BAC_BOX_LNOR) & 1) != 0)) {
          Vec_StrPrintStr(pVVar2,"~");
        }
        Bac_ManWriteSig(p,i_00 - 1);
        uVar7 = BVar5 - BAC_BOX_AND;
        if ((uVar7 < 8) && ((0xcfU >> (uVar7 & 0x1f) & 1) != 0)) {
          pcVar10 = &DAT_007a44f0 + *(int *)(&DAT_007a44f0 + (ulong)uVar7 * 4);
        }
        else {
          pcVar10 = " ^ ";
          if ((BVar5 & 0x3ffffffe) != BAC_BOX_XOR) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                          ,0x1d3,"void Bac_ManWriteAssign(Bac_Ntk_t *, int)");
          }
        }
        Vec_StrPrintStr(pVVar2,pcVar10);
        iVar4 = i_00 - 2;
LAB_00327912:
        Bac_ManWriteSig(p,iVar4);
      }
      else {
        if (iVar4 == 1) {
          if (BVar5 != BAC_BOX_BUF) {
            if (BVar5 != BAC_BOX_INV) {
              __assert_fail("Type == BAC_BOX_BUF",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x1c1,"void Bac_ManWriteAssign(Bac_Ntk_t *, int)");
            }
            Vec_StrPrintStr(pVVar2,"~");
          }
          iVar4 = i_00 - 1;
          goto LAB_00327912;
        }
        if (iVar4 == 0) {
          switch(BVar5) {
          case BAC_BOX_CF:
            pcVar10 = "1\'b0";
            break;
          case BAC_BOX_CT:
            pcVar10 = "1\'b1";
            break;
          case BAC_BOX_CX:
            pcVar10 = "1\'bx";
            break;
          case BAC_BOX_CZ:
            pcVar10 = "1\'bz";
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                          ,0x1bb,"void Bac_ManWriteAssign(Bac_Ntk_t *, int)");
          }
          Vec_StrPrintStr(pVVar2,pcVar10);
        }
      }
      Vec_StrPrintStr(pVVar2,";\n");
      goto LAB_00327957;
    }
    iVar4 = p_01->nSize;
    iVar12 = Bac_ObjIsBoxUser(p,i_00);
    if (iVar12 == 0) {
      iVar12 = Bac_ObjIsBoxUser(p,i_00);
      if (iVar12 != 0) {
        __assert_fail("!Bac_ObjIsBoxUser(p, iBox)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x1e4,"Vec_Int_t *Bac_BoxCollectRanges(Bac_Ntk_t *, int)");
      }
      DAT_00b756a8 = Bac_BoxCollectRanges_pArray;
      _Bac_BoxCollectRanges_Bits = 10;
      uVar7 = i_00;
LAB_00327227:
      do {
        uVar20 = uVar7;
        uVar13 = i_00;
        if ((int)uVar20 < 1) goto LAB_003272bd;
        uVar7 = uVar20 - 1;
        iVar12 = Bac_ObjIsBi(p,uVar7);
        if (iVar12 == 0) goto LAB_003272bd;
        iVar12 = Bac_ObjBit(p,uVar7);
        if (iVar12 == 0) {
          iVar12 = Bac_ObjIsBi(p,uVar7);
          if (iVar12 != 0) {
            uVar17 = (ulong)uVar7;
            iVar12 = Bac_ObjBit(p,uVar7);
            uVar13 = uVar7;
            if (iVar12 == 0) {
              do {
                uVar19 = uVar13;
                uVar16 = (uint)uVar17;
                if ((int)uVar19 < 1) {
                  uVar19 = 0;
                  break;
                }
                uVar13 = uVar19 - 1;
                uVar16 = uVar13;
                iVar12 = Bac_ObjIsBi(p,uVar13);
                if (iVar12 == 0) break;
                uVar17 = (ulong)uVar13;
                iVar12 = Bac_ObjBit(p,uVar13);
                uVar16 = (uint)uVar17;
              } while (iVar12 != 0);
              Vec_IntPush((Vec_Int_t *)(ulong)(uVar20 - uVar19),uVar16);
              goto LAB_00327227;
            }
          }
          __assert_fail("Bac_ObjIsBi(p, i) && !Bac_ObjBit(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                        ,0x139,"int Bac_BoxBiRange(Bac_Ntk_t *, int)");
        }
      } while( true );
    }
    pBVar3 = p->pDesign;
    uVar7 = Bac_BoxNtkId(p,i_00);
    if (((int)uVar7 < 1) || (pBVar3->nNtks < (int)uVar7)) {
      p_03 = (Bac_Ntk_t *)0x0;
    }
    else {
      p_03 = pBVar3->pNtks + uVar7;
    }
    Vec_StrPrintStr(p_01,"  ");
    pcVar10 = Bac_NtkName(p_03);
    Vec_StrPrintStr(p_01,pcVar10);
    Vec_StrPrintStr(p_01," ");
    iVar12 = Bac_ObjName(p,i_00);
    pcVar10 = "";
    if (iVar12 != 0) {
      pcVar10 = Bac_ObjNameStr(p,i_00);
    }
    Vec_StrPrintStr(p_01,pcVar10);
    Vec_StrPrintStr(p_01," (");
    iVar12 = (p_03->vInfo).nSize;
    if (iVar12 + 2U < 5) {
      __assert_fail("Bac_NtkInfoNum(pModel)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                    ,0x1fa,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
    }
    p_00 = &p_03->vInfo;
    iVar18 = 0;
    local_7c = 0;
    for (iVar6 = 0; iVar6 + 2 < iVar12; iVar6 = iVar6 + 3) {
      iVar12 = Vec_IntEntry(p_00,iVar6);
      iVar8 = Vec_IntEntry(p_00,iVar6 + 1);
      iVar9 = Vec_IntEntry(p_00,iVar6 + 2);
      i = Abc_Lit2Var2(iVar12);
      iVar12 = Abc_Lit2Att2(iVar12);
      pcVar10 = "    \"%s\", ";
      if (iVar6 == 0) {
        pcVar10 = "T = %d\t\t";
      }
      Vec_StrPrintStr(p_01,pcVar10 + 8);
      iVar1 = p_01->nSize;
      if (iVar4 + 0x46 < iVar1) {
        Vec_StrPrintStr(p_01,"\n    ");
        iVar4 = iVar1;
      }
      Vec_StrPrintStr(p_01,".");
      pcVar10 = Bac_NtkStr(p,i);
      Vec_StrPrintStr(p_01,pcVar10);
      Vec_StrPrintStr(p_01,"(");
      iVar9 = iVar9 - iVar8;
      iVar8 = -iVar9;
      if (0 < iVar9) {
        iVar8 = iVar9;
      }
      iVar8 = iVar8 + 1;
      if (iVar12 == 2) {
        iVar12 = Bac_ObjIsBox(p,i_00);
        if (iVar12 == 0) {
          __assert_fail("Bac_ObjIsBox(p, b)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                        ,0x134,"int Bac_BoxBo(Bac_Ntk_t *, int, int)");
        }
        Bac_ManWriteConcat(p,i_00 + 1 + iVar18,iVar8);
        iVar18 = iVar8 + iVar18;
      }
      else {
        if (iVar12 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                        ,0x20e,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
        }
        iVar12 = Bac_ObjIsBox(p,i_00);
        if (iVar12 == 0) {
          __assert_fail("Bac_ObjIsBox(p, b)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                        ,0x133,"int Bac_BoxBi(Bac_Ntk_t *, int, int)");
        }
        Bac_ManWriteConcat(p,~local_7c + i_00,iVar8);
        local_7c = local_7c + iVar8;
      }
      Vec_StrPrintStr(p_01,")");
      iVar12 = (p_03->vInfo).nSize;
    }
    uVar7 = Bac_BoxBiNum(p,i_00);
    if (local_7c != uVar7) {
      __assert_fail("i == Bac_BoxBiNum(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                    ,0x211,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
    }
    iVar4 = Bac_BoxBoNum(p,i_00);
    if (iVar18 != iVar4) {
      __assert_fail("o == Bac_BoxBoNum(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                    ,0x212,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
    }
    goto LAB_003278dd;
  }
  goto LAB_00327957;
LAB_00327354:
  if (9 < DAT_00b756a4) {
    __assert_fail("Vec_IntSize(vBits) < 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                  ,0x1ef,"Vec_Int_t *Bac_BoxCollectRanges(Bac_Ntk_t *, int)");
  }
  BVar5 = Bac_ObjType(p,i_00);
  pcVar11 = Bac_NtkGenerateName(p,BVar5,(Vec_Int_t *)&Bac_BoxCollectRanges_Bits);
  pBVar3 = p->pDesign;
  BVar5 = Bac_ObjType(p,i_00);
  pcVar10 = pBVar3->pPrimSymbs[BVar5];
  Vec_StrPrintStr(p_01,"  ");
  Vec_StrPrintStr(p_01,pcVar11);
  Vec_StrPrintStr(p_01," ");
  iVar12 = Bac_ObjName(p,i_00);
  pcVar11 = "";
  if (iVar12 != 0) {
    pcVar11 = Bac_ObjNameStr(p,i_00);
  }
  Vec_StrPrintStr(p_01,pcVar11);
  Vec_StrPrintStr(p_01," (");
  uVar17 = 0;
  uVar7 = i_00;
  while (uVar13 = i_00, 0 < (int)uVar7) {
    uVar7 = uVar7 - 1;
    iVar12 = Bac_ObjIsBi(p,uVar7);
    if (iVar12 == 0) break;
    iVar12 = Bac_ObjBit(p,uVar7);
    if (iVar12 == 0) {
      iVar18 = (int)uVar17;
      iVar12 = Vec_IntEntry((Vec_Int_t *)&Bac_BoxCollectRanges_Bits,iVar18);
      pcVar11 = "    \"%s\", ";
      if (iVar18 == 0) {
        pcVar11 = "T = %d\t\t";
      }
      Vec_StrPrintStr(p_01,pcVar11 + 8);
      iVar6 = p_01->nSize;
      if (iVar4 + 0x46 < iVar6) {
        Vec_StrPrintStr(p_01,"\n    ");
        iVar4 = iVar6;
      }
      Vec_StrPrintStr(p_01,".");
      Vec_StrPush(p_01,pcVar10[uVar17]);
      Vec_StrPrintStr(p_01,"(");
      Bac_ManWriteConcat(p,uVar7,iVar12);
      Vec_StrPrintStr(p_01,")");
      uVar17 = (ulong)(iVar18 + 1);
    }
  }
  while( true ) {
    uVar13 = uVar13 + 1;
    iVar12 = (int)uVar17;
    if (((p->vType).nSize <= (int)uVar13) || (iVar18 = Bac_ObjIsBo(p,uVar13), iVar18 == 0)) break;
    iVar18 = Bac_ObjBit(p,uVar13);
    if (iVar18 == 0) {
      iVar18 = Vec_IntEntry((Vec_Int_t *)&Bac_BoxCollectRanges_Bits,iVar12);
      pcVar11 = "    \"%s\", ";
      if (iVar12 == 0) {
        pcVar11 = "T = %d\t\t";
      }
      Vec_StrPrintStr(p_01,pcVar11 + 8);
      iVar6 = p_01->nSize;
      if (iVar4 + 0x46 < iVar6) {
        Vec_StrPrintStr(p_01,"\n    ");
        iVar4 = iVar6;
      }
      Vec_StrPrintStr(p_01,".");
      Vec_StrPush(p_01,pcVar10[uVar17]);
      Vec_StrPrintStr(p_01,"(");
      Bac_ManWriteConcat(p,uVar13,iVar18);
      Vec_StrPrintStr(p_01,")");
      uVar17 = (ulong)(iVar12 + 1);
    }
  }
  if (iVar12 != DAT_00b756a4) {
    __assert_fail("iSig == Vec_IntSize(vBits)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x240,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
  }
LAB_003278dd:
  Vec_StrPrintStr(p_01,");\n");
LAB_00327957:
  i_00 = i_00 + 1;
  iVar15 = iVar15 + 1;
  iVar14 = iVar14 + 1;
  goto LAB_00326ee3;
LAB_003272bd:
  do {
    uVar7 = uVar13;
    uVar13 = uVar7 + 1;
    if (((p->vType).nSize <= (int)uVar13) || (iVar12 = Bac_ObjIsBo(p,uVar13), iVar12 == 0))
    goto LAB_00327354;
    iVar12 = Bac_ObjBit(p,uVar13);
  } while (iVar12 != 0);
  iVar12 = Bac_ObjIsBo(p,uVar13);
  if (iVar12 != 0) {
    uVar17 = (ulong)uVar13;
    iVar12 = Bac_ObjBit(p,uVar13);
    if (iVar12 == 0) {
      uVar20 = 1;
      do {
        uVar19 = uVar20;
        uVar16 = (uint)uVar17;
        uVar20 = uVar7 + uVar19 + 1;
        if (((p->vType).nSize <= (int)uVar20) ||
           (uVar16 = uVar20, iVar12 = Bac_ObjIsBo(p,uVar20), iVar12 == 0)) break;
        uVar17 = (ulong)uVar20;
        iVar12 = Bac_ObjBit(p,uVar20);
        uVar16 = (uint)uVar17;
        uVar20 = uVar19 + 1;
      } while (iVar12 != 0);
      Vec_IntPush((Vec_Int_t *)(ulong)uVar19,uVar16);
      goto LAB_003272bd;
    }
  }
  __assert_fail("Bac_ObjIsBo(p, i) && !Bac_ObjBit(p, i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                ,0x13a,"int Bac_BoxBoRange(Bac_Ntk_t *, int)");
}

Assistant:

void Bac_ManWriteVerilogBoxes( Bac_Ntk_t * p, int fUseAssign )
{
    Vec_Str_t * vStr = p->pDesign->vOut;
    int iObj, k, i, o, StartPos;
    Bac_NtkForEachBox( p, iObj ) // .subckt/.gate/box (formal/actual binding) 
    {
        // skip constants
        if ( Bac_ObjIsConst(p, iObj) )
            continue;
        // write mapped
        if ( Bac_ObjIsGate(p, iObj) )
        {
            Bac_ManWriteGate( p, iObj );
            continue;
        }
        // write primitives as assign-statements
        if ( !Bac_ObjIsBoxUser(p, iObj) && fUseAssign )
        {
            Bac_ManWriteAssign( p, iObj );
            continue;
        }
        // write header
        StartPos = Vec_StrSize(vStr);
        if ( Bac_ObjIsBoxUser(p, iObj) )
        {
            int Value, Beg, End, Range;
            Bac_Ntk_t * pModel = Bac_BoxNtk( p, iObj );
            Vec_StrPrintStr( vStr, "  " );
            Vec_StrPrintStr( vStr, Bac_NtkName(pModel) );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Bac_ObjName(p, iObj) ? Bac_ObjNameStr(p, iObj) : ""  );
            Vec_StrPrintStr( vStr, " (" );
            // write arguments
            i = o = 0;
            assert( Bac_NtkInfoNum(pModel) );
            Vec_IntForEachEntryTriple( &pModel->vInfo, Value, Beg, End, k )
            {
                int NameId = Abc_Lit2Var2( Value );
                int Type = Abc_Lit2Att2( Value );
                Vec_StrPrintStr( vStr, k ? ", " : "" );
                if ( Vec_StrSize(vStr) > StartPos + 70 )
                {
                    StartPos = Vec_StrSize(vStr);
                    Vec_StrPrintStr( vStr, "\n    " );
                }
                Vec_StrPrintStr( vStr, "." );
                Vec_StrPrintStr( vStr, Bac_NtkStr(p, NameId) );
                Vec_StrPrintStr( vStr, "(" );
                Range = Bac_InfoRange( Beg, End );
                assert( Range > 0 );
                if ( Type == 1 )
                    Bac_ManWriteConcat( p, Bac_BoxBi(p, iObj, i), Range ), i += Range;
                else if ( Type == 2 )
                    Bac_ManWriteConcat( p, Bac_BoxBo(p, iObj, o), Range ), o += Range;
                else assert( 0 );
                Vec_StrPrintStr( vStr, ")" );
            }
            assert( i == Bac_BoxBiNum(p, iObj) );
            assert( o == Bac_BoxBoNum(p, iObj) );
        }
        else
        {
            int iTerm, k, Range, iSig = 0;
            Vec_Int_t * vBits = Bac_BoxCollectRanges( p, iObj );
            char * pName = Bac_NtkGenerateName( p, Bac_ObjType(p, iObj), vBits );
            char * pSymbs = Bac_ManPrimSymb( p->pDesign, Bac_ObjType(p, iObj) );
            Vec_StrPrintStr( vStr, "  " );
            Vec_StrPrintStr( vStr, pName );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Bac_ObjName(p, iObj) ? Bac_ObjNameStr(p, iObj) : ""  );
            Vec_StrPrintStr( vStr, " (" );
            // write inputs
            Bac_BoxForEachBiMain( p, iObj, iTerm, k )
            {
                Range = Vec_IntEntry( vBits, iSig );
                Vec_StrPrintStr( vStr, iSig ? ", " : "" );
                if ( Vec_StrSize(vStr) > StartPos + 70 )
                {
                    StartPos = Vec_StrSize(vStr);
                    Vec_StrPrintStr( vStr, "\n    " );
                }
                Vec_StrPrintStr( vStr, "." );
                Vec_StrPush( vStr, pSymbs[iSig] );
                Vec_StrPrintStr( vStr, "(" );
                Bac_ManWriteConcat( p, iTerm, Range );
                Vec_StrPrintStr( vStr, ")" );
                iSig++;
            }
            Bac_BoxForEachBoMain( p, iObj, iTerm, k )
            {
                Range = Vec_IntEntry( vBits, iSig );
                Vec_StrPrintStr( vStr, iSig ? ", " : "" );
                if ( Vec_StrSize(vStr) > StartPos + 70 )
                {
                    StartPos = Vec_StrSize(vStr);
                    Vec_StrPrintStr( vStr, "\n    " );
                }
                Vec_StrPrintStr( vStr, "." );
                Vec_StrPush( vStr, pSymbs[iSig] );
                Vec_StrPrintStr( vStr, "(" );
                Bac_ManWriteConcat( p, iTerm, Range );
                Vec_StrPrintStr( vStr, ")" );
                iSig++;
            }
            assert( iSig == Vec_IntSize(vBits) );
        }
        Vec_StrPrintStr( vStr, ");\n" );
    }
}